

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int ffghad(fitsfile *fptr,long *headstart,long *datastart,long *dataend,int *status)

{
  fitsfile *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  LONGLONG *in_R8;
  LONGLONG edata;
  LONGLONG sdata;
  LONGLONG shead;
  int *in_stack_ffffffffffffffb8;
  LONGLONG *in_stack_ffffffffffffffc0;
  LONGLONG *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  if ((int)*in_R8 < 1) {
    ffghadll(in_RCX,in_R8,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
    if (in_RSI != (undefined8 *)0x0) {
      if ((long)in_stack_ffffffffffffffc8 <= 0x7fffffffffffffff) {
        *in_RSI = in_stack_ffffffffffffffc8;
      }
      else {
        *(int *)in_R8 = 0x19c;
      }
    }
    if (in_RDX != (undefined8 *)0x0) {
      if ((long)in_stack_ffffffffffffffc0 <= 0x7fffffffffffffff) {
        *in_RDX = in_stack_ffffffffffffffc0;
      }
      else {
        *(int *)in_R8 = 0x19c;
      }
    }
    if (in_RCX != (fitsfile *)0x0) {
      if ((long)in_stack_ffffffffffffffb8 <= 0x7fffffffffffffff) {
        *(int **)in_RCX = in_stack_ffffffffffffffb8;
      }
      else {
        *(int *)in_R8 = 0x19c;
      }
    }
    local_4 = (int)*in_R8;
  }
  else {
    local_4 = (int)*in_R8;
  }
  return local_4;
}

Assistant:

int ffghad(fitsfile *fptr,     /* I - FITS file pointer                     */
            long *headstart,  /* O - byte offset to beginning of CHDU      */
            long *datastart,  /* O - byte offset to beginning of next HDU  */
            long *dataend,    /* O - byte offset to beginning of next HDU  */
            int *status)       /* IO - error status     */
/*
  Return the address (= byte offset) in the FITS file to the beginning of
  the current HDU, the beginning of the data unit, and the end of the data unit.
*/
{
    LONGLONG shead, sdata, edata;

    if (*status > 0)
        return(*status);

    ffghadll(fptr, &shead, &sdata, &edata, status);

    if (headstart)
    {
        if (shead > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *headstart = (long) shead;
    }

    if (datastart)
    {
        if (sdata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *datastart = (long) sdata;
    }

    if (dataend)
    {
        if (edata > LONG_MAX)
            *status = NUM_OVERFLOW;
        else
            *dataend = (long) edata;       
    }

    return(*status);
}